

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::make_single_prediction(ldf *data,single_learner *base,example *ec)

{
  undefined8 uVar1;
  wclass *pwVar2;
  size_t in_RDX;
  label_feature_map *in_RDI;
  uint64_t old_offset;
  label_data simple_label;
  label ld;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar3;
  label_feature_map *in_stack_ffffffffffffffa0;
  undefined4 uStack_40;
  v_array<COST_SENSITIVE::wclass> local_38;
  size_t local_18;
  label_feature_map *local_8;
  
  local_38._begin = *(wclass **)(in_RDX + 0x6828);
  local_38._end = *(wclass **)(in_RDX + 0x6830);
  local_38.end_array = *(wclass **)(in_RDX + 0x6838);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6840);
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<COST_SENSITIVE::wclass>::operator[](&local_38,0);
  LabelDict::add_example_namespace_from_memory
            (in_stack_ffffffffffffffa0,
             (example *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDX);
  *(ulong *)(local_18 + 0x6828) = CONCAT44(uStack_40,0x7f7fffff);
  *(undefined4 *)(local_18 + 0x6830) = 0;
  uVar1 = *(undefined8 *)(local_18 + 0x6820);
  *(unsigned_long **)(local_18 + 0x6820) = local_8[1].default_value.indicies.end_array;
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)in_stack_ffffffffffffffa0,
             (example *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDX);
  *(undefined8 *)(local_18 + 0x6820) = uVar1;
  fVar3 = *(float *)(local_18 + 0x68a8);
  pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](&local_38,0);
  pwVar2->partial_prediction = fVar3;
  v_array<COST_SENSITIVE::wclass>::operator[](&local_38,0);
  LabelDict::del_example_namespace_from_memory
            (local_8,(example *)CONCAT44(fVar3,in_stack_ffffffffffffff98),in_RDX);
  *(wclass **)(local_18 + 0x6828) = local_38._begin;
  *(wclass **)(local_18 + 0x6830) = local_38._end;
  *(wclass **)(local_18 + 0x6838) = local_38.end_array;
  *(size_t *)(local_18 + 0x6840) = local_38.erase_count;
  return;
}

Assistant:

void make_single_prediction(ldf& data, single_learner& base, example& ec)
{
  COST_SENSITIVE::label ld = ec.l.cs;
  label_data simple_label;
  simple_label.initial = 0.;
  simple_label.label = FLT_MAX;

  LabelDict::add_example_namespace_from_memory(data.label_features, ec, ld.costs[0].class_index);

  ec.l.simple = simple_label;
  uint64_t old_offset = ec.ft_offset;
  ec.ft_offset = data.ft_offset;
  base.predict(ec);  // make a prediction
  ec.ft_offset = old_offset;
  ld.costs[0].partial_prediction = ec.partial_prediction;

  LabelDict::del_example_namespace_from_memory(data.label_features, ec, ld.costs[0].class_index);
  ec.l.cs = ld;
}